

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.hpp
# Opt level: O1

void viennamath::inplace_simplify<viennamath::rt_expression_interface<double>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e)

{
  int iVar1;
  undefined4 extraout_var;
  rt_expression_interface<double> *prVar2;
  
  prVar2 = (e->rt_expr_)._M_ptr;
  while( true ) {
    iVar1 = (*prVar2->_vptr_rt_expression_interface[0x11])();
    if ((char)iVar1 == '\0') break;
    iVar1 = (*((e->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[0x10])();
    prVar2 = (e->rt_expr_)._M_ptr;
    if (prVar2 != (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1)) {
      if (prVar2 != (rt_expression_interface<double> *)0x0) {
        (*prVar2->_vptr_rt_expression_interface[1])();
      }
      (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1);
    }
    prVar2 = (e->rt_expr_)._M_ptr;
  }
  return;
}

Assistant:

void inplace_simplify(rt_expr<InterfaceType> & e)
  {
    while (e.get()->can_simplify())
      e = e.get()->simplify();
  }